

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O2

void compute_padded_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  long lVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  float *pfVar11;
  int j;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  long lVar22;
  long lVar23;
  float *pfVar24;
  int i;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  float *pfVar30;
  long lVar31;
  long lVar32;
  float *pfVar33;
  int i_2;
  float fVar34;
  float fVar35;
  float *local_a0;
  float *local_98;
  long local_90;
  
  iVar3 = iimage->data_width;
  lVar27 = (long)iVar3;
  iVar28 = iimage->width;
  pfVar21 = iimage->padded_data;
  lVar29 = (long)iimage->data_height;
  iVar4 = iimage->height;
  lVar1 = lVar27 + -7;
  uVar10 = (iVar3 - iVar28) / 2;
  pfVar15 = pfVar21;
  for (uVar12 = 0; uVar12 != (~((int)uVar10 >> 0x1f) & uVar10); uVar12 = uVar12 + 1) {
    pfVar14 = pfVar15;
    for (lVar25 = 0; lVar25 < lVar1; lVar25 = lVar25 + 8) {
      pfVar20 = pfVar15 + lVar25;
      pfVar20[0] = 0.0;
      pfVar20[1] = 0.0;
      pfVar20[2] = 0.0;
      pfVar20[3] = 0.0;
      pfVar20[4] = 0.0;
      pfVar20[5] = 0.0;
      pfVar20[6] = 0.0;
      pfVar20[7] = 0.0;
      pfVar14 = pfVar14 + 8;
    }
    for (; lVar25 < lVar27; lVar25 = lVar25 + 1) {
      *pfVar14 = 0.0;
      pfVar14 = pfVar14 + 1;
    }
    pfVar15 = pfVar15 + lVar27;
  }
  lVar31 = (long)(int)uVar10;
  lVar16 = lVar27 * lVar31;
  pfVar15 = pfVar21 + lVar16;
  for (lVar25 = lVar31; lVar25 < lVar29; lVar25 = lVar25 + 1) {
    pfVar14 = pfVar15;
    for (lVar26 = 0; lVar26 < (int)(uVar10 - 7); lVar26 = lVar26 + 8) {
      *(undefined1 (*) [32])(pfVar15 + lVar26) = ZEXT432(0) << 0x40;
      pfVar14 = pfVar14 + 8;
    }
    for (; lVar26 < lVar31; lVar26 = lVar26 + 1) {
      *pfVar14 = 0.0;
      pfVar14 = pfVar14 + 1;
    }
    pfVar15 = pfVar15 + lVar27;
  }
  lVar32 = (long)iimage->width;
  lVar17 = (long)iimage->data_width;
  pfVar14 = iimage->data;
  iVar5 = iimage->height;
  fVar34 = 0.0;
  fVar35 = 0.0;
  pfVar15 = pfVar14 + lVar17 + 1;
  lVar25 = lVar32 + -2;
  for (lVar26 = 0; lVar26 < lVar25; lVar26 = lVar26 + 2) {
    fVar6 = fVar35 + gray_image[lVar26];
    pfVar14[lVar26] = fVar6;
    fVar35 = fVar6 + gray_image[lVar26 + 1];
    pfVar14[lVar26 + 1] = fVar35;
    fVar2 = gray_image[lVar32 + lVar26];
    pfVar15[lVar26 + -1] = fVar6 + fVar34 + fVar2;
    fVar34 = fVar34 + fVar2 + gray_image[lVar32 + lVar26 + 1];
    pfVar15[lVar26] = fVar34 + pfVar14[lVar26 + 1];
  }
  pfVar20 = pfVar14 + lVar17;
  for (; lVar26 < lVar32; lVar26 = lVar26 + 1) {
    fVar35 = fVar35 + gray_image[lVar26];
    pfVar14[lVar26] = fVar35;
    fVar34 = fVar34 + gray_image[lVar32 + lVar26];
    pfVar20[lVar26] = fVar35 + fVar34;
  }
  pfVar33 = pfVar14 + lVar17 * 2 + 1;
  pfVar30 = gray_image + lVar32 * 2 + 1;
  lVar23 = 0;
  local_90 = 0;
  pfVar24 = pfVar14 + lVar17 * 3 + 1;
  pfVar11 = gray_image + lVar32 * 3 + 1;
  pfVar19 = pfVar20;
  local_a0 = pfVar14 + lVar17 * 2;
  local_98 = gray_image + lVar32 * 2;
  for (lVar26 = 2; lVar26 < (long)iVar5 + -2; lVar26 = lVar26 + 2) {
    fVar34 = 0.0;
    fVar35 = 0.0;
    lVar18 = local_90;
    lVar22 = lVar23;
    for (lVar13 = 0; lVar13 < lVar25; lVar13 = lVar13 + 2) {
      fVar2 = pfVar30[lVar13 + -1];
      lVar18 = lVar18 + 8;
      lVar22 = lVar22 + 8;
      fVar6 = fVar35 + fVar2 + pfVar15[lVar13 + -1];
      pfVar33[lVar13 + -1] = fVar6;
      fVar35 = fVar35 + fVar2 + pfVar30[lVar13];
      pfVar33[lVar13] = fVar35 + pfVar15[lVar13];
      fVar2 = pfVar11[lVar13 + -1];
      pfVar24[lVar13 + -1] = fVar6 + fVar34 + fVar2;
      fVar34 = fVar34 + fVar2 + pfVar11[lVar13];
      pfVar24[lVar13] = fVar34 + pfVar33[lVar13];
    }
    for (; lVar13 < lVar32; lVar13 = lVar13 + 1) {
      fVar35 = fVar35 + *(float *)((long)(gray_image + lVar32 * 2) + lVar22);
      fVar2 = fVar35 + *(float *)((long)pfVar20 + lVar18);
      *(float *)((long)(pfVar14 + lVar17 * 2) + lVar18) = fVar2;
      fVar34 = fVar34 + *(float *)((long)gray_image + lVar22 + lVar32 * 0xc);
      lVar22 = lVar22 + 4;
      *(float *)((long)pfVar14 + lVar18 + lVar17 * 0xc) = fVar2 + fVar34;
      lVar18 = lVar18 + 4;
    }
    pfVar33 = pfVar33 + lVar17 * 2;
    pfVar15 = pfVar15 + lVar17 * 2;
    local_a0 = local_a0 + lVar17 * 2;
    pfVar19 = pfVar19 + lVar17 * 2;
    pfVar24 = pfVar24 + lVar17 * 2;
    local_90 = local_90 + lVar17 * 8;
    local_98 = local_98 + lVar32 * 2;
    pfVar30 = pfVar30 + lVar32 * 2;
    pfVar11 = pfVar11 + lVar32 * 2;
    lVar23 = lVar23 + lVar32 * 8;
  }
  for (; lVar26 < iVar5; lVar26 = lVar26 + 1) {
    fVar35 = 0.0;
    pfVar14 = local_98;
    pfVar20 = pfVar19;
    pfVar24 = local_a0;
    for (lVar23 = 0; lVar23 < lVar25; lVar23 = lVar23 + 2) {
      fVar34 = pfVar30[lVar23 + -1];
      pfVar24 = pfVar24 + 2;
      pfVar20 = pfVar20 + 2;
      pfVar14 = pfVar14 + 2;
      pfVar33[lVar23 + -1] = fVar35 + fVar34 + pfVar15[lVar23 + -1];
      fVar35 = fVar35 + fVar34 + pfVar30[lVar23];
      pfVar33[lVar23] = fVar35 + pfVar15[lVar23];
    }
    for (; lVar23 < lVar32; lVar23 = lVar23 + 1) {
      fVar35 = fVar35 + *pfVar14;
      pfVar14 = pfVar14 + 1;
      fVar34 = *pfVar20;
      pfVar20 = pfVar20 + 1;
      *pfVar24 = fVar35 + fVar34;
      pfVar24 = pfVar24 + 1;
    }
    pfVar33 = pfVar33 + lVar17;
    pfVar15 = pfVar15 + lVar17;
    pfVar30 = pfVar30 + lVar32;
    local_a0 = local_a0 + lVar17;
    pfVar19 = pfVar19 + lVar17;
    local_98 = local_98 + lVar32;
  }
  iVar28 = uVar10 + iVar28;
  pfVar15 = pfVar21 + lVar16;
  lVar17 = iVar4 + lVar31;
  lVar26 = (long)iVar28;
  pfVar14 = pfVar21 + lVar16 + lVar26;
  for (lVar25 = lVar31; lVar25 < lVar17; lVar25 = lVar25 + 1) {
    fVar35 = pfVar21[(long)((int)lVar25 * iVar3 + iVar28) + -1];
    pfVar20 = pfVar14;
    for (lVar16 = lVar26; lVar16 < lVar1; lVar16 = lVar16 + 8) {
      pfVar33 = pfVar15 + lVar16;
      *pfVar33 = fVar35;
      pfVar33[1] = fVar35;
      pfVar33[2] = fVar35;
      pfVar33[3] = fVar35;
      pfVar33[4] = fVar35;
      pfVar33[5] = fVar35;
      pfVar33[6] = fVar35;
      pfVar33[7] = fVar35;
      pfVar20 = pfVar20 + 8;
    }
    for (; lVar16 < lVar27; lVar16 = lVar16 + 1) {
      *pfVar20 = fVar35;
      pfVar20 = pfVar20 + 1;
    }
    pfVar15 = pfVar15 + lVar27;
    pfVar14 = pfVar14 + lVar27;
  }
  lVar23 = lVar27 * lVar17;
  lVar16 = (lVar17 + -1) * lVar27;
  pfVar15 = pfVar21 + lVar23;
  pfVar14 = pfVar21 + lVar16;
  lVar32 = 0;
  for (lVar25 = lVar17; lVar18 = lVar32, lVar22 = lVar31, lVar25 < lVar29; lVar25 = lVar25 + 1) {
    for (; lVar22 < iVar28 + -7; lVar22 = lVar22 + 8) {
      pfVar20 = pfVar14 + lVar22;
      fVar35 = pfVar20[1];
      fVar34 = pfVar20[2];
      fVar2 = pfVar20[3];
      fVar6 = pfVar20[4];
      fVar7 = pfVar20[5];
      fVar8 = pfVar20[6];
      fVar9 = pfVar20[7];
      lVar18 = lVar18 + 0x20;
      pfVar33 = pfVar15 + lVar22;
      *pfVar33 = *pfVar20;
      pfVar33[1] = fVar35;
      pfVar33[2] = fVar34;
      pfVar33[3] = fVar2;
      pfVar33[4] = fVar6;
      pfVar33[5] = fVar7;
      pfVar33[6] = fVar8;
      pfVar33[7] = fVar9;
    }
    for (; lVar22 < lVar26; lVar22 = lVar22 + 1) {
      *(undefined4 *)((long)pfVar21 + lVar18 + lVar31 * 4 + lVar23 * 4) =
           *(undefined4 *)((long)pfVar21 + lVar18 + lVar31 * 4 + lVar16 * 4);
      lVar18 = lVar18 + 4;
    }
    pfVar14 = pfVar14 + lVar27;
    pfVar15 = pfVar15 + lVar27;
    lVar32 = lVar32 + lVar27 * 4;
  }
  fVar35 = pfVar21[(long)(iVar28 + ((int)lVar17 + -1) * iVar3) + -1];
  pfVar15 = pfVar21 + lVar23;
  pfVar21 = pfVar21 + lVar23 + lVar26;
  for (; pfVar14 = pfVar21, lVar25 = lVar26, lVar17 < lVar29; lVar17 = lVar17 + 1) {
    for (; lVar25 < lVar1; lVar25 = lVar25 + 8) {
      pfVar20 = pfVar15 + lVar25;
      *pfVar20 = fVar35;
      pfVar20[1] = fVar35;
      pfVar20[2] = fVar35;
      pfVar20[3] = fVar35;
      pfVar20[4] = fVar35;
      pfVar20[5] = fVar35;
      pfVar20[6] = fVar35;
      pfVar20[7] = fVar35;
      pfVar14 = pfVar14 + 8;
    }
    for (; lVar25 < lVar27; lVar25 = lVar25 + 1) {
      *pfVar14 = fVar35;
      pfVar14 = pfVar14 + 1;
    }
    pfVar15 = pfVar15 + lVar27;
    pfVar21 = pfVar21 + lVar27;
  }
  return;
}

Assistant:

void compute_padded_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        float sum = 0.0f;
        float sum1 = 0.0f;
        
        int data_width = iimage->data_width;
        int width = iimage->width;
        int width_limit = width - 2;
        int height_limit = iimage->height - 2;
        float *iimage_data = iimage->data;

        int i = 0;
        // first row extra, since we don't have 0 padding
        for (i = 0; i < width_limit; i += 2) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            sum += gray_image[i + 1];
            iimage_data[i + 1] = sum;

            sum1 += gray_image[width + i];
            iimage_data[data_width + i] = iimage_data[i] + sum1;
            sum1 += gray_image[width + i + 1];
            iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
        }

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; i < width; ++i) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            // printf("row 0, col %i sum: %f\n", i, sum);
            sum1 += gray_image[width + i];
            // printf("row 1, col %i sum: %f\n", i, sum1);
            iimage_data[data_width + i] = iimage_data[i] + sum1;
        }

        // Handle all elements after the first row.
        i = 2;
        for (; i < height_limit; i += 2) {
            sum = 0.0f;
            sum1 = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
                sum1 += gray_image[(i + 1) * width + j + 1];
                iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
            }
            // printf("j: %i\n", j);

            // Handle last element of an image with odd width extra.
            // If previous stride = 2, then there should only be one element covered in this loop.
            // This might change if we increase the stride.
            for (; j < width; ++j) {
                // printf("j: %i; sum1: %f\n", j, sum1);
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                // printf("sum1: %f\n", sum1);
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            }
        }

        // Handle last element of an image with odd height extra.
        // If previous stride = 2, then there should only be one row covered in this loop.
        // This might change if we increase the stride.
        for (; i < iimage->height ; ++i) {
            sum = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                // printf("j: %i; sum1: %f\n", j, sum);

                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
            }
            // printf("j: %i\n", j);

            for (; j < width; ++j) {
                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            }
        }
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}